

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void VP8LCollectColorBlueTransforms_C
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_blue,
               int red_to_blue,int *histo)

{
  uint32_t uVar1;
  bool bVar2;
  ulong uVar3;
  
  if (0 < tile_height) {
    do {
      if (0 < tile_width) {
        uVar3 = 0;
        do {
          uVar1 = argb[uVar3];
          histo[uVar1 - (((uint)((int)(char)(uVar1 >> 0x10) * (int)(char)red_to_blue) >> 5) +
                        ((uint)((int)(char)(uVar1 >> 8) * (int)(char)green_to_blue) >> 5)) & 0xff] =
               histo[uVar1 - (((uint)((int)(char)(uVar1 >> 0x10) * (int)(char)red_to_blue) >> 5) +
                             ((uint)((int)(char)(uVar1 >> 8) * (int)(char)green_to_blue) >> 5)) &
                     0xff] + 1;
          uVar3 = uVar3 + 1;
        } while ((uint)tile_width != uVar3);
      }
      argb = argb + stride;
      bVar2 = 1 < tile_height;
      tile_height = tile_height + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void VP8LCollectColorBlueTransforms_C(const uint32_t* argb, int stride,
                                      int tile_width, int tile_height,
                                      int green_to_blue, int red_to_blue,
                                      int histo[]) {
  while (tile_height-- > 0) {
    int x;
    for (x = 0; x < tile_width; ++x) {
      ++histo[TransformColorBlue((uint8_t)green_to_blue, (uint8_t)red_to_blue,
                                 argb[x])];
    }
    argb += stride;
  }
}